

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O1

tensor * di(tensor *a,double q)

{
  long *plVar1;
  tensor *ptVar2;
  initializer_list<tensor_*> __l;
  allocator_type local_39;
  double local_38;
  vector<tensor_*,_std::allocator<tensor_*>_> local_30;
  tensor *local_18;
  
  local_38 = q;
  plVar1 = (long *)operator_new(0x48);
  *plVar1 = 0;
  plVar1[1] = 0;
  plVar1[2] = 0;
  plVar1[3] = 0;
  plVar1[4] = 0;
  plVar1[5] = 0;
  plVar1[6] = 0;
  plVar1[7] = 0;
  plVar1[8] = 0;
  *plVar1 = (long)&PTR_forward_0010a988;
  *(undefined1 *)(plVar1 + 8) = 0;
  node::node_cnt = node::node_cnt + 1;
  *plVar1 = (long)&PTR_forward_0010aab0;
  __l._M_len = 1;
  __l._M_array = &local_18;
  local_18 = a;
  std::vector<tensor_*,_std::allocator<tensor_*>_>::vector(&local_30,__l,&local_39);
  ptVar2 = (tensor *)(**(code **)(*plVar1 + 8))(SUB84(local_38,0),plVar1,&local_30);
  if (local_30.super__Vector_base<tensor_*,_std::allocator<tensor_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<tensor_*,_std::allocator<tensor_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<tensor_*,_std::allocator<tensor_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<tensor_*,_std::allocator<tensor_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return ptVar2;
}

Assistant:

tensor* di(tensor *a, double q){
    node *op = new Div();
    return op->forward({a},q);
}